

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_ClearRGBA(GPU_Target *target,Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  GPU_Target *pGVar1;
  char *pcVar2;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar2 = "NULL renderer";
    goto LAB_001383eb;
  }
  pGVar1 = _gpu_current_renderer->current_context_target;
  if (target == (GPU_Target *)0x0 || pGVar1 != (GPU_Target *)0x0) {
LAB_00138392:
    if (pGVar1 != (GPU_Target *)0x0) {
      (*_gpu_current_renderer->impl->ClearRGBA)(_gpu_current_renderer,target,r,g,b,a);
      return;
    }
  }
  else if (target->context != (GPU_Context *)0x0) {
    GPU_MakeCurrent(target,target->context->windowID);
    pGVar1 = _gpu_current_renderer->current_context_target;
    goto LAB_00138392;
  }
  pcVar2 = "NULL context";
LAB_001383eb:
  GPU_PushErrorCode("GPU_ClearRGBA",GPU_ERROR_USER_ERROR,"%s",pcVar2);
  return;
}

Assistant:

void GPU_ClearRGBA(GPU_Target* target, Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    _gpu_current_renderer->impl->ClearRGBA(_gpu_current_renderer, target, r, g, b, a);
}